

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

uchar * nvpair_unpack_bool(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  byte bVar1;
  int *piVar2;
  
  if (nvp->nvp_type != 2) {
    __assert_fail("nvp->nvp_type == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x2c2,
                  "const unsigned char *nvpair_unpack_bool(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  if ((nvp->nvp_datasize == 1) && (*leftp != 0)) {
    bVar1 = *ptr;
    *leftp = *leftp - 1;
    if ((ulong)bVar1 < 2) {
      nvp->nvp_data = (ulong)bVar1;
      return ptr + 1;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_bool(bool isbe __unused, nvpair_t *nvp, const unsigned char *ptr,
    size_t *leftp)
{
	uint8_t value;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_BOOL);

	if (nvp->nvp_datasize != sizeof(value)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}
	if (*leftp < sizeof(value)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	memcpy(&value, ptr, sizeof(value));
	ptr += sizeof(value);
	*leftp -= sizeof(value);

	if (value != 0 && value != 1) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp->nvp_data = (uint64_t)value;

	return (ptr);
}